

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::Combine<duckdb::MinMaxState<unsigned_short>,duckdb::MaxOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  ushort *puVar3;
  ushort *puVar4;
  idx_t iVar5;
  
  if (count != 0) {
    pdVar1 = source->data;
    pdVar2 = target->data;
    iVar5 = 0;
    do {
      puVar3 = *(ushort **)(pdVar1 + iVar5 * 8);
      if ((char)puVar3[1] == '\x01') {
        puVar4 = *(ushort **)(pdVar2 + iVar5 * 8);
        if ((char)puVar4[1] == '\0') {
          *(undefined4 *)puVar4 = *(undefined4 *)puVar3;
        }
        else if (*puVar4 < *puVar3) {
          *puVar4 = *puVar3;
        }
      }
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}